

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetOneofCaseName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  allocator<char> local_45 [13];
  undefined1 local_38 [8];
  string property_name;
  FieldDescriptor *descriptor_local;
  
  property_name.field_2._8_8_ = this;
  GetPropertyName_abi_cxx11_((string *)local_38,this,descriptor);
  bVar1 = std::operator==((string *)local_38,"None");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None_",local_45);
    std::allocator<char>::~allocator(local_45);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetOneofCaseName(const FieldDescriptor* descriptor) {
  // The name in a oneof case enum is the same as for the property, but as we
  // always have a "None" value as well, we need to reserve that by appending an
  // underscore.
  std::string property_name = GetPropertyName(descriptor);
  return property_name == "None" ? "None_" : property_name;
}